

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HexDump.cpp
# Opt level: O2

ostream * arangodb::velocypack::operator<<(ostream *stream,HexDump *hexdump)

{
  string local_30;
  
  HexDump::toString_abi_cxx11_(&local_30,hexdump);
  std::operator<<(stream,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, HexDump const& hexdump) {
  stream << hexdump.toString();
  return stream;
}